

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O3

void test_case_signed_add(zt_unit_test *test,void *data)

{
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  return;
}

Assistant:

static void
test_case_signed_add(struct zt_unit_test *test, void *data UNUSED)
{
    /* CHAR pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(CHAR_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(1, CHAR_MAX)); */

    /* CHAR neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(CHAR_MIN, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(-1, CHAR_MIN)); */

    /* CHAR limits */
    ZT_UNIT_ASSERT(test, zt_char_add(CHAR_MIN, 1) == CHAR_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_char_add(1, CHAR_MIN) == CHAR_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_char_add(CHAR_MAX, -1) == CHAR_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_char_add(-1, CHAR_MAX) == CHAR_MAX - 1);
    /* CHAR middle */
    ZT_UNIT_ASSERT(test, zt_char_add(CHAR_MAX / 2, 1) == CHAR_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_char_add(1, CHAR_MAX / 2) == CHAR_MAX / 2 + 1);


    /* SHORT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(SHORT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(1, SHORT_MAX)); */

    /* SHORT neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(SHORT_MIN, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(-1, SHORT_MIN)); */

    /* SHORT limits */
    ZT_UNIT_ASSERT(test, zt_short_add(SHORT_MIN, 1) == SHORT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_short_add(1, SHORT_MIN) == SHORT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_short_add(SHORT_MAX, -1) == SHORT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_short_add(-1, SHORT_MAX) == SHORT_MAX - 1);
    /* SHORT middle */
    ZT_UNIT_ASSERT(test, zt_short_add(SHORT_MAX / 2, 1) == SHORT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_short_add(1, SHORT_MAX / 2) == SHORT_MAX / 2 + 1);

    /* INT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(INT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(1, INT_MAX)); */

    /* INT neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(INT_MIN, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(-1, INT_MIN)); */

    /* INT limits */
    ZT_UNIT_ASSERT(test, zt_int_add(INT_MIN, 1) == INT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_int_add(1, INT_MIN) == INT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_int_add(INT_MAX, -1) == INT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_int_add(-1, INT_MAX) == INT_MAX - 1);
    /* INT middle */
    ZT_UNIT_ASSERT(test, zt_int_add(INT_MAX / 2, 1) == INT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_int_add(1, INT_MAX / 2) == INT_MAX / 2 + 1);

# ifndef __x86_64__
    /* LONG pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(LONG_MAX, 0L)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(1L, LONG_MAX)); */
    /* LONG neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(LONG_MIN, -1L)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(-1L, LONG_MIN)); */
    /* LONG limits */
    ZT_UNIT_ASSERT(test, zt_long_add(LONG_MIN, 1L) == LONG_MIN + 1L);
    ZT_UNIT_ASSERT(test, zt_long_add(1L, LONG_MIN) == LONG_MIN + 1L);
    ZT_UNIT_ASSERT(test, zt_long_add(LONG_MAX, -1L) == LONG_MAX - 1L);
    ZT_UNIT_ASSERT(test, zt_long_add(-1L, LONG_MAX) == LONG_MAX - 1L);
    /* LONG middle */
    ZT_UNIT_ASSERT(test, zt_long_add(LONG_MAX / 2, 1) == LONG_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_long_add(1, LONG_MAX / 2) == LONG_MAX / 2 + 1);
# endif /* ifndef __x86_64__ */
}